

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

bool __thiscall smf::MidiFile::writeHex(MidiFile *this,ostream *out,int width)

{
  byte bVar1;
  _Setfill<char> _Var2;
  int iVar3;
  _Setw _Var4;
  byte *pbVar5;
  ostream *poVar6;
  size_t in_RCX;
  void *__buf;
  char cVar7;
  int local_220;
  string local_208 [32];
  uint local_1e8;
  int local_1e4;
  int value;
  int i;
  int linewidth;
  int wordcount;
  int local_1b8;
  int len;
  stringstream local_1a8 [8];
  stringstream tempstream;
  undefined1 local_198 [380];
  int local_1c;
  ostream *poStack_18;
  int width_local;
  ostream *out_local;
  MidiFile *this_local;
  
  local_1c = width;
  poStack_18 = out;
  out_local = (ostream *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  write(this,(int)local_198,__buf,in_RCX);
  std::__cxx11::stringstream::str();
  iVar3 = std::__cxx11::string::length();
  std::__cxx11::string::~string((string *)&linewidth);
  i = 1;
  if (local_1c < 0) {
    local_220 = 0x19;
  }
  else {
    local_220 = local_1c;
  }
  value = local_220;
  local_1b8 = iVar3;
  for (local_1e4 = 0; local_1e4 < local_1b8; local_1e4 = local_1e4 + 1) {
    std::__cxx11::stringstream::str();
    pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)local_208);
    bVar1 = *pbVar5;
    std::__cxx11::string::~string(local_208);
    local_1e8 = (uint)bVar1;
    poVar6 = (ostream *)std::ostream::operator<<(poStack_18,std::hex);
    _Var4 = std::setw(2);
    poVar6 = std::operator<<(poVar6,_Var4);
    _Var2 = std::setfill<char>('0');
    poVar6 = std::operator<<(poVar6,_Var2._M_c);
    std::ostream::operator<<(poVar6,local_1e8);
    if (value == 0) {
      if (local_1e4 < local_1b8 + -1) {
        std::operator<<(poStack_18,' ');
      }
    }
    else {
      if (local_1e4 < local_1b8 + -1) {
        cVar7 = '\n';
        if (i % value != 0) {
          cVar7 = ' ';
        }
        std::operator<<(poStack_18,cVar7);
      }
      i = i + 1;
    }
  }
  if (value != 0) {
    std::operator<<(poStack_18,'\n');
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return true;
}

Assistant:

bool MidiFile::writeHex(std::ostream& out, int width) {
	std::stringstream tempstream;
	MidiFile::write(tempstream);
	int len = (int)tempstream.str().length();
	int wordcount = 1;
	int linewidth = width >= 0 ? width : 25;
	for (int i=0; i<len; i++) {
		int value = (uchar)tempstream.str()[i];
		out << std::hex << std::setw(2) << std::setfill('0') << value;
		if (linewidth) {
			if (i < len - 1) {
				out << ((wordcount % linewidth) ? ' ' : '\n');
			}
			wordcount++;
		} else {
			// print with no line breaks
			if (i < len - 1) {
				out << ' ';
			}
		}
	}
	if (linewidth) {
		out << '\n';
	}
	return true;
}